

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SstReader::SstReader(SstReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  long lVar1;
  char *pcVar2;
  char *__src;
  SstStream p_Var3;
  _func_void_ptr_void_ptr_char_ptr_int_void_ptr *p_Var4;
  _func_void_ptr_void_ptr_char_ptr_int_int_size_t_ptr_size_t_ptr_size_t_ptr *p_Var5;
  _func_void_ptr_void_ptr_int_size_t_ptr *MinArrayCallback;
  _func_void_void_ptr_char_ptr_int_void_ptr *p_Var6;
  _func_void_void_ptr_void_ptr_int_int_int_size_t_ptr_size_t_ptr_size_t_ptr *p_Var7;
  long *in_RDI;
  anon_class_1_0_00000001 arrayMinBlocksInfoCallback;
  anon_class_1_0_00000001 MinArraySetupUpcall;
  anon_class_1_0_00000001 arrayBlocksInfoCallback;
  anon_class_1_0_00000001 arrayFFSCallback;
  anon_class_1_0_00000001 attrFFSCallback;
  anon_class_1_0_00000001 varFFSCallback;
  char *cstr;
  Comm *in_stack_fffffffffffffde8;
  Comm *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  int commRank;
  string *in_stack_fffffffffffffe38;
  string *activity;
  Comm *in_stack_fffffffffffffe48;
  string *source;
  undefined8 in_stack_fffffffffffffe50;
  Mode openMode;
  string *component;
  string *in_stack_fffffffffffffe58;
  IO *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  Engine *in_stack_fffffffffffffe70;
  __4 local_14e;
  __2 local_14d;
  __5 local_14c;
  __1 local_14b;
  __3 local_14a;
  __0 local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [24];
  SMPI_Comm in_stack_ffffffffffffff38;
  SstParams in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined1 local_91 [33];
  char *local_70;
  allocator local_49;
  string local_48 [72];
  
  openMode = (Mode)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"SstReader",&local_49);
  helper::Comm::Comm(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Engine::Engine(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,openMode,in_stack_fffffffffffffe48);
  helper::Comm::~Comm((Comm *)0xe6e3a2);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *in_RDI = (long)&PTR__SstReader_011385d8;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1d] = 0;
  std::
  unordered_map<const_adios2::core::VariableBase_*,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>_>
  ::unordered_map((unordered_map<const_adios2::core::VariableBase_*,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>_>
                   *)0xe6e403);
  lVar1 = std::__cxx11::string::length();
  pcVar2 = (char *)operator_new__(lVar1 + 1);
  local_70 = pcVar2;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar2,__src);
  (**(code **)(*in_RDI + 0xa8))();
  p_Var3 = SstReaderOpen(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38);
  in_RDI[0x18] = (long)p_Var3;
  if (in_RDI[0x18] == 0) {
    if (local_70 != (char *)0x0) {
      operator_delete__(local_70);
    }
    component = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"Engine",(allocator *)component);
    source = (string *)&stack0xffffffffffffff47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff48,"SstReader",(allocator *)source)
    ;
    activity = (string *)&local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"SstReader",(allocator *)activity);
    std::operator+((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    commRank = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    helper::Throw<std::runtime_error>(component,source,activity,in_stack_fffffffffffffe38,commRank);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
  }
  SstReaderGetParams((SstStream)in_RDI[0x18],(SstMarshalMethod *)(in_RDI + 0x19),
                     (int *)((long)in_RDI + 0xcc));
  if (SstReader::UseMin == -1) {
    pcVar2 = getenv("OldBlocksInfo");
    SstReader::UseMin = (int)(pcVar2 != (char *)0x0);
  }
  if (SstReader::UseMin == 0) {
    p_Var3 = (SstStream)in_RDI[0x18];
    p_Var4 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_0::operator_cast_to_function_pointer(&local_149);
    p_Var5 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_1::operator_cast_to_function_pointer(&local_14b);
    p_Var6 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_3::operator_cast_to_function_pointer(&local_14a);
    p_Var7 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_5::operator_cast_to_function_pointer(&local_14c);
    SstReaderInitFFSCallback(p_Var3,in_RDI,p_Var4,p_Var5,(MinArraySetupUpcallFunc)0x0,p_Var6,p_Var7)
    ;
  }
  else {
    p_Var3 = (SstStream)in_RDI[0x18];
    p_Var4 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_0::operator_cast_to_function_pointer(&local_149);
    p_Var5 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_1::operator_cast_to_function_pointer(&local_14b);
    MinArrayCallback =
         SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
         ::$_2::operator_cast_to_function_pointer(&local_14d);
    p_Var6 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_3::operator_cast_to_function_pointer(&local_14a);
    p_Var7 = SstReader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
             ::$_4::operator_cast_to_function_pointer(&local_14e);
    SstReaderInitFFSCallback(p_Var3,in_RDI,p_Var4,p_Var5,MinArrayCallback,p_Var6,p_Var7);
  }
  if (local_70 != (char *)0x0) {
    operator_delete__(local_70);
  }
  *(undefined1 *)(in_RDI + 0x10) = 1;
  return;
}

Assistant:

SstReader::SstReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("SstReader", io, name, mode, std::move(comm))
{
    char *cstr = new char[name.length() + 1];
    std::strcpy(cstr, name.c_str());

    Init();

    m_Input = SstReaderOpen(cstr, &Params, &m_Comm);
    if (!m_Input)
    {
        delete[] cstr;
        helper::Throw<std::runtime_error>("Engine", "SstReader", "SstReader",
                                          "SstReader did not find active "
                                          "Writer contact info in file \"" +
                                              m_Name + SST_POSTFIX +
                                              "\".  Timeout or non-current SST contact file?");
    }

    // Maybe need other writer-side params in the future, but for now only
    // marshal method, and if the writer is row major.
    SstReaderGetParams(m_Input, &m_WriterMarshalMethod, &m_WriterIsRowMajor);

    auto varFFSCallback = [](void *reader, const char *variableName, const int type, void *data) {
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }

#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable = &(Reader->m_IO.DefineVariable<T>(variableName));                   \
        variable->SetData((T *)data);                                                              \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }

        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type

        return (void *)NULL;
    };

    auto attrFFSCallback = [](void *reader, const char *attrName, const int type, void *data) {
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        adios2::DataType Type = (adios2::DataType)type;
        if (attrName == NULL)
        {
            // if attrName is NULL, prepare for attr reinstallation
            Reader->m_IO.RemoveAllAttributes();
            return;
        }
        try
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                Reader->m_IO.DefineAttribute<std::string>(attrName, *(char **)data, "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Reader->m_IO.DefineAttribute<T>(attrName, *(T *)data, "", "/", true);                      \
    }

            ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        catch (...)
        {
            //            std::cout << "Load failed" << std::endl;
            return;
        }
        return;
    };

    auto arrayFFSCallback = [](void *reader, const char *variableName, const int type, int DimCount,
                               size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(0);
                VecCount.push_back(Shape[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable =                                                                    \
            &(Reader->m_IO.DefineVariable<T>(variableName, VecShape, VecStart, VecCount));         \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return (void *)NULL;
    };

    auto arrayBlocksInfoCallback = [](void *reader, void *variable, const int type, int WriterRank,
                                      int DimCount, size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        size_t currentStep = SstCurrentStep(Reader->m_Input);

        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(Start[i]);
                VecCount.push_back(Count[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *Var = reinterpret_cast<class Variable<T> *>(variable);                        \
        auto savedShape = Var->m_Shape;                                                            \
        auto savedCount = Var->m_Count;                                                            \
        auto savedStart = Var->m_Start;                                                            \
        Var->m_Shape = VecShape;                                                                   \
        Var->m_Count = VecCount;                                                                   \
        Var->m_Start = VecStart;                                                                   \
        Var->SetBlockInfo((T *)NULL, currentStep);                                                 \
        Var->m_Shape = savedShape;                                                                 \
        Var->m_Count = savedCount;                                                                 \
        Var->m_Start = savedStart;                                                                 \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return;
    };

    auto MinArraySetupUpcall = [](void *reader, int DimCount, size_t *Shape) {
        MinVarInfo *MV = new MinVarInfo(DimCount, Shape);
        return (void *)MV;
    };
    auto arrayMinBlocksInfoCallback = [](void *reader, void *MV, const int type, int WriterRank,
                                         int DimCount, size_t *Shape, size_t *Start,
                                         size_t *Count) {
        MinBlockInfo MBI;
        MinVarInfo *MinVar = (MinVarInfo *)MV;

        MBI.WriterID = WriterRank;
        MBI.BlockID = 0;
        MBI.Start = Start;
        MBI.Count = Count;

        MinVar->BlocksInfo.push_back(MBI);
        return;
    };

    static int UseMin = 1;
    if (UseMin == -1)
    {
        if (getenv("OldBlocksInfo") == NULL)
        {
            UseMin = 0;
        }
        else
        {
            UseMin = 1;
        }
    }
    if (UseMin)
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback,
                                 MinArraySetupUpcall, attrFFSCallback, arrayMinBlocksInfoCallback);
    else
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback, NULL,
                                 attrFFSCallback, arrayBlocksInfoCallback);

    delete[] cstr;
    m_IsOpen = true;
}